

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.h
# Opt level: O0

void __thiscall Assimp::ASE::Mesh::Mesh(Mesh *this,Mesh *param_1)

{
  long local_20;
  Mesh *param_1_local;
  Mesh *this_local;
  
  MeshWithSmoothingGroups<Assimp::ASE::Face>::MeshWithSmoothingGroups
            (&this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>,
             &param_1->super_MeshWithSmoothingGroups<Assimp::ASE::Face>);
  BaseNode::BaseNode(&this->super_BaseNode,&param_1->super_BaseNode);
  local_20 = 0;
  do {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
              (this->amTexCoords + local_20,param_1->amTexCoords + local_20);
    local_20 = local_20 + 1;
  } while (local_20 != 8);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::vector
            (&this->mVertexColors,&param_1->mVertexColors);
  std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::vector
            (&this->mBoneVertices,&param_1->mBoneVertices);
  std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::vector
            (&this->mBones,&param_1->mBones);
  memcpy(&this->iMaterialIndex,&param_1->iMaterialIndex,0x25);
  return;
}

Assistant:

Mesh() = delete;